

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O2

void __thiscall
CVmDynamicFunc::restore_from_file
          (CVmDynamicFunc *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  int iVar1;
  uint uVar2;
  uint obj_ref_cnt;
  vm_dynfunc_ext *val;
  ulong uVar3;
  ulong uVar4;
  char buf [5];
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  uVar2 = CVmFile::read_uint2(fp);
  obj_ref_cnt = CVmFile::read_uint2(fp);
  val = vm_dynfunc_ext::alloc_ext(this,(ulong)uVar2,obj_ref_cnt);
  (this->super_CVmObject).ext_ = (char *)val;
  CVmFile::read_bytes(fp,buf,5);
  CVmObjFixup::fix_dh(fixups,buf);
  vmb_get_dh(buf,&val->method_ctx);
  CVmFile::read_bytes(fp,buf,5);
  CVmObjFixup::fix_dh(fixups,buf);
  vmb_get_dh(buf,&val->src);
  val->obj_refs[val->obj_ref_cnt] = self;
  iVar1 = val->obj_ref_cnt;
  CVmFile::read_bytes(fp,(char *)(val[1].obj_refs + (long)iVar1 + -0xb),(ulong)uVar2);
  uVar3 = 0;
  uVar4 = (ulong)obj_ref_cnt;
  if ((int)obj_ref_cnt < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    uVar2 = CVmFile::read_uint2(fp);
    val->obj_refs[uVar3] = uVar2;
    CVmObjFixup::fix_vmb_obj
              (fixups,(char *)((long)(val[1].obj_refs + (long)iVar1 + -0xb) + (ulong)uVar2));
  }
  return;
}

Assistant:

void CVmDynamicFunc::restore_from_file(VMG_ vm_obj_id_t self,
                                       CVmFile *fp, CVmObjFixup *fixups)
{
    char buf[VMB_DATAHOLDER];
    
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the bytecode length and object reference count */
    size_t bytecode_len = fp->read_uint2();
    int obj_ref_cnt = fp->read_uint2();

    /* allocate the extension */
    vm_dynfunc_ext *ext = vm_dynfunc_ext::alloc_ext(
        vmg_ this, bytecode_len, obj_ref_cnt);
    ext_ = (char *)ext;

    /* read the method context object */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->method_ctx);

    /* read the source object */
    fp->read_bytes(buf, VMB_DATAHOLDER);
    fixups->fix_dh(vmg_ buf);
    vmb_get_dh(buf, &ext->src);

    /* set up the dynamic object code prefix header */
    vmb_put_objid(ext->get_prefix_ptr(), self);

    /* read the bytecode */
    char *bc = ext->get_bytecode_ptr();
    fp->read_bytes(bc, bytecode_len);

    /* read the object references, fixing each one up in the bytecode */
    for (int i = 0 ; i < obj_ref_cnt ; ++i)
    {
        /* read and save the offset of this reference */
        uint ofs = ext->obj_refs[i] = fp->read_uint2();

        /* fix up the object ID in the bytecode data */
        fixups->fix_vmb_obj(vmg_ bc + ofs);
    }
}